

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::pickPasses(TranslateToFuzzReader *this,OptimizationOptions *options)

{
  Random *this_00;
  bool bVar1;
  uint32_t uVar2;
  PassInfo local_90;
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  *local_38;
  
  this_00 = &this->random;
  bVar1 = Random::oneIn(this_00,2);
  if (bVar1) {
    OptimizationOptions::PassInfo::PassInfo(&local_90,"enclose-world");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(&options->passes,&local_90);
    OptimizationOptions::PassInfo::~PassInfo(&local_90);
  }
  local_38 = &options->passes;
LAB_00159578:
  if (((0x13 < (ulong)(((long)(options->passes).
                              super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(options->passes).
                             super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x58)) ||
      ((this->random).finishedInput != false)) || (bVar1 = Random::oneIn(this_00,3), bVar1)) {
    bVar1 = Random::oneIn(this_00,2);
    if (bVar1) {
      uVar2 = Random::upTo(this_00,4);
      (options->super_ToolOptions).passOptions.optimizeLevel = uVar2;
      uVar2 = Random::upTo(this_00,3);
      (options->super_ToolOptions).passOptions.shrinkLevel = uVar2;
    }
    if (((options->super_ToolOptions).passOptions.closedWorld == false) &&
       (bVar1 = Random::oneIn(this_00,2), bVar1)) {
      (options->super_ToolOptions).passOptions.closedWorld = true;
    }
    bVar1 = Random::oneIn(this_00,2);
    if (bVar1) {
      OptimizationOptions::PassInfo::PassInfo(&local_90,"legalize-and-prune-js-interface");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
      OptimizationOptions::PassInfo::~PassInfo(&local_90);
    }
    if ((((this->wasm->features).features & 0x400) != 0) &&
       (bVar1 = Random::oneIn(this_00,10), !bVar1)) {
      OptimizationOptions::PassInfo::PassInfo(&local_90,"dce");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
      OptimizationOptions::PassInfo::~PassInfo(&local_90);
    }
    return;
  }
  uVar2 = Random::upTo(this_00,0x2a);
  switch(uVar2) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
    uVar2 = Random::upTo(this_00,4);
    (options->super_ToolOptions).passOptions.optimizeLevel = uVar2;
    uVar2 = Random::upTo(this_00,3);
    (options->super_ToolOptions).passOptions.shrinkLevel = uVar2;
    OptimizationOptions::addDefaultOptPasses(options);
    goto LAB_00159578;
  case 5:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"coalesce-locals");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 6:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"code-pushing");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 7:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"code-folding");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 8:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"dce");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 9:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"duplicate-function-elimination");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 10:
    if (((this->wasm->features).features & 0x540) != 0) goto LAB_00159578;
    OptimizationOptions::PassInfo::PassInfo(&local_90,"flatten");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    OptimizationOptions::PassInfo::~PassInfo(&local_90);
    bVar1 = Random::oneIn(this_00,2);
    if (!bVar1) goto LAB_00159578;
    OptimizationOptions::PassInfo::PassInfo(&local_90,"rereloop");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xb:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"inlining");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xc:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"inlining-optimizing");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xd:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"local-cse");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xe:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"memory-packing");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xf:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"merge-blocks");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x10:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"optimize-instructions");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x11:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"pick-load-signs");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x12:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"precompute");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x13:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"precompute-propagate");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x14:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"remove-unused-brs");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x15:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"remove-unused-module-elements");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x16:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"remove-unused-names");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x17:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"reorder-functions");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x18:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"reorder-locals");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x19:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"directize");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x1a:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"simplify-locals");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x1b:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"simplify-locals-notee");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x1c:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"simplify-locals-nostructure");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x1d:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"simplify-locals-notee-nostructure");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x1e:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"ssa");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x1f:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"vacuum");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x20:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"merge-locals");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x21:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"licm");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x22:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"tuple-optimization");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x23:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"rse");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x24:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"monomorphize");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x25:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"monomorphize-always");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
    goto switchD_001595d5_caseD_26;
  default:
    ::wasm::handle_unreachable
              ("unexpected value",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x130);
  }
  goto LAB_00159bbc;
switchD_001595d5_caseD_26:
  if (((this->wasm->features).features & 0x400) == 0) goto LAB_00159578;
  (options->super_ToolOptions).passOptions.closedWorld = true;
  this->closedWorld = true;
  uVar2 = Random::upTo(this_00,0x10);
  switch(uVar2) {
  case 0:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"abstract-type-refining");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 1:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"cfp");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 2:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"gsi");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 3:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"gto");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 4:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"heap2local");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 5:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"heap-store-optimization");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 6:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"minimize-rec-groups");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 7:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"remove-unused-types");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 8:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"signature-pruning");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 9:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"signature-refining");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 10:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"type-finalizing");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xb:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"type-refining");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xc:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"type-merging");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xd:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"type-ssa");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xe:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"type-unfinalizing");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  case 0xf:
    OptimizationOptions::PassInfo::PassInfo(&local_90,"unsubtyping");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::emplace_back<wasm::OptimizationOptions::PassInfo>(local_38,&local_90);
    break;
  default:
    ::wasm::handle_unreachable
              ("unexpected value",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,299);
  }
LAB_00159bbc:
  OptimizationOptions::PassInfo::~PassInfo(&local_90);
  goto LAB_00159578;
}

Assistant:

void TranslateToFuzzReader::pickPasses(OptimizationOptions& options) {
  // Pick random passes to further shape the wasm. This is similar to how we
  // pick random passes in fuzz_opt.py, but the goal there is to find problems
  // in the passes, while the goal here is more to shape the wasm, so that
  // translate-to-fuzz emits interesting outputs (the latter is important for
  // things like ClusterFuzz, where we are using Binaryen to fuzz other things
  // than itself). As a result, the list of passes here is different from
  // fuzz_opt.py.

  // Enclose the world, some of the time. We do this before picking any other
  // passes so that we make the initial fuzz contents more optimizable by
  // closed-world passes later. Note that we do this regardless of whether we
  // are in closed-world mode or not, as it is good to get this variety
  // regardless.
  if (oneIn(2)) {
    options.passes.push_back("enclose-world");
  }

  // Main selection of passes.
  while (options.passes.size() < 20 && !random.finished() && !oneIn(3)) {
    switch (upTo(42)) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 4: {
        options.passOptions.optimizeLevel = upTo(4);
        options.passOptions.shrinkLevel = upTo(3);
        options.addDefaultOptPasses();
        break;
      }
      case 5:
        options.passes.push_back("coalesce-locals");
        break;
      case 6:
        options.passes.push_back("code-pushing");
        break;
      case 7:
        options.passes.push_back("code-folding");
        break;
      case 8:
        options.passes.push_back("dce");
        break;
      case 9:
        options.passes.push_back("duplicate-function-elimination");
        break;
      case 10:
        // Some features do not support flatten yet.
        if (!wasm.features.hasReferenceTypes() &&
            !wasm.features.hasExceptionHandling() && !wasm.features.hasGC()) {
          options.passes.push_back("flatten");
          if (oneIn(2)) {
            options.passes.push_back("rereloop");
          }
        }
        break;
      case 11:
        options.passes.push_back("inlining");
        break;
      case 12:
        options.passes.push_back("inlining-optimizing");
        break;
      case 13:
        options.passes.push_back("local-cse");
        break;
      case 14:
        options.passes.push_back("memory-packing");
        break;
      case 15:
        options.passes.push_back("merge-blocks");
        break;
      case 16:
        options.passes.push_back("optimize-instructions");
        break;
      case 17:
        options.passes.push_back("pick-load-signs");
        break;
      case 18:
        options.passes.push_back("precompute");
        break;
      case 19:
        options.passes.push_back("precompute-propagate");
        break;
      case 20:
        options.passes.push_back("remove-unused-brs");
        break;
      case 21:
        options.passes.push_back("remove-unused-module-elements");
        break;
      case 22:
        options.passes.push_back("remove-unused-names");
        break;
      case 23:
        options.passes.push_back("reorder-functions");
        break;
      case 24:
        options.passes.push_back("reorder-locals");
        break;
      case 25:
        options.passes.push_back("directize");
        break;
      case 26:
        options.passes.push_back("simplify-locals");
        break;
      case 27:
        options.passes.push_back("simplify-locals-notee");
        break;
      case 28:
        options.passes.push_back("simplify-locals-nostructure");
        break;
      case 29:
        options.passes.push_back("simplify-locals-notee-nostructure");
        break;
      case 30:
        options.passes.push_back("ssa");
        break;
      case 31:
        options.passes.push_back("vacuum");
        break;
      case 32:
        options.passes.push_back("merge-locals");
        break;
      case 33:
        options.passes.push_back("licm");
        break;
      case 34:
        options.passes.push_back("tuple-optimization");
        break;
      case 35:
        options.passes.push_back("rse");
        break;
      case 36:
        options.passes.push_back("monomorphize");
        break;
      case 37:
        options.passes.push_back("monomorphize-always");
        break;
      case 38:
      case 39:
      case 40:
      case 41:
        // GC specific passes.
        if (wasm.features.hasGC()) {
          // Most of these depend on closed world, so just set that. Set it both
          // on the global pass options, and in the internal state of this
          // TranslateToFuzzReader instance.
          options.passOptions.closedWorld = true;
          closedWorld = true;

          switch (upTo(16)) {
            case 0:
              options.passes.push_back("abstract-type-refining");
              break;
            case 1:
              options.passes.push_back("cfp");
              break;
            case 2:
              options.passes.push_back("gsi");
              break;
            case 3:
              options.passes.push_back("gto");
              break;
            case 4:
              options.passes.push_back("heap2local");
              break;
            case 5:
              options.passes.push_back("heap-store-optimization");
              break;
            case 6:
              options.passes.push_back("minimize-rec-groups");
              break;
            case 7:
              options.passes.push_back("remove-unused-types");
              break;
            case 8:
              options.passes.push_back("signature-pruning");
              break;
            case 9:
              options.passes.push_back("signature-refining");
              break;
            case 10:
              options.passes.push_back("type-finalizing");
              break;
            case 11:
              options.passes.push_back("type-refining");
              break;
            case 12:
              options.passes.push_back("type-merging");
              break;
            case 13:
              options.passes.push_back("type-ssa");
              break;
            case 14:
              options.passes.push_back("type-unfinalizing");
              break;
            case 15:
              options.passes.push_back("unsubtyping");
              break;
            default:
              WASM_UNREACHABLE("unexpected value");
          }
        }
        break;
      default:
        WASM_UNREACHABLE("unexpected value");
    }
  }

  if (oneIn(2)) {
    // We randomize these when we pick -O?, but sometimes do so even without, as
    // they affect some passes.
    options.passOptions.optimizeLevel = upTo(4);
    options.passOptions.shrinkLevel = upTo(3);
  }

  if (!options.passOptions.closedWorld && oneIn(2)) {
    options.passOptions.closedWorld = true;
  }

  // Prune things that error in JS if we call them (like SIMD), some of the
  // time. This alters the wasm/JS boundary quite a lot, so testing both forms
  // is useful.
  if (oneIn(2)) {
    options.passes.push_back("legalize-and-prune-js-interface");
  }

  // Usually DCE at the very end, to ensure that our binaries validate in other
  // VMs, due to how non-nullable local validation and unreachable code
  // interact. See fuzz_opt.py and
  //   https://github.com/WebAssembly/binaryen/pull/5665
  //   https://github.com/WebAssembly/binaryen/issues/5599
  if (wasm.features.hasGC() && !oneIn(10)) {
    options.passes.push_back("dce");
  }

  // TODO: We could in theory run some function-level passes on particular
  //       functions, but then we'd need to do this after generation, not
  //       before (and random data no longer remains then).
}